

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Silent_Blip_Buffer::Silent_Blip_Buffer(Silent_Blip_Buffer *this)

{
  *(undefined8 *)&(this->super_Blip_Buffer).offset_ = 0;
  *(undefined8 *)((long)&(this->super_Blip_Buffer).buffer_ + 4) = 0;
  (this->super_Blip_Buffer).reader_accum_ = 0;
  (this->super_Blip_Buffer).bass_shift_ = 0;
  (this->super_Blip_Buffer).sample_rate_ = 0;
  (this->super_Blip_Buffer).clock_rate_ = 0;
  (this->super_Blip_Buffer).bass_freq_ = 0x10;
  (this->super_Blip_Buffer).length_ = 0;
  (this->super_Blip_Buffer).factor_ = 0;
  (this->super_Blip_Buffer).buffer_ = (buf_t_ *)&(this->super_Blip_Buffer).field_0x3c;
  (this->super_Blip_Buffer).buffer_size_ = 1;
  *(undefined8 *)&(this->super_Blip_Buffer).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  *(undefined8 *)&this->field_0x4c = 0;
  *(undefined8 *)&this->field_0x54 = 0;
  *(undefined8 *)&this->field_0x5c = 0;
  *(undefined8 *)&this->field_0x64 = 0;
  *(undefined8 *)&this->field_0x6c = 0;
  *(undefined8 *)&this->field_0x74 = 0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(undefined8 *)&this->field_0x80 = 0;
  return;
}

Assistant:

Blip_Buffer::Blip_Buffer()
{
	factor_       = (blip_ulong)-1 / 2;
	offset_       = 0;
	buffer_       = 0;
	buffer_size_  = 0;
	sample_rate_  = 0;
	reader_accum_ = 0;
	bass_shift_   = 0;
	clock_rate_   = 0;
	bass_freq_    = 16;
	length_       = 0;
	
	// assumptions code makes about implementation-defined features
	#ifndef NDEBUG
		// right shift of negative value preserves sign
		buf_t_ i = -0x7FFFFFFE;
		assert( (i >> 1) == -0x3FFFFFFF );
		
		// casting to short truncates to 16 bits and sign-extends
		i = 0x18000;
		assert( (short) i == -0x8000 );
	#endif
}